

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_compress_destSize(char *src,char *dst,int *srcSizePtr,int targetDstSize)

{
  ulong *puVar1;
  char *pcVar2;
  ushort uVar3;
  short sVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  void *__s;
  short *psVar9;
  ulong uVar10;
  ulong uVar11;
  long *plVar12;
  long *plVar13;
  char cVar14;
  long lVar15;
  U16 *hashTable;
  int iVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long *plVar21;
  char *pcVar22;
  BYTE *e;
  short *psVar23;
  char *pcVar24;
  ulong *puVar25;
  int iVar26;
  ulong *puVar27;
  ulong uVar28;
  int *piVar29;
  short *local_60;
  int local_58;
  
  __s = malloc(0x4020);
  if (__s == (void *)0x0) {
    return 0;
  }
  if (((ulong)__s & 7) == 0) {
    memset(__s,0,0x4020);
  }
  uVar8 = *srcSizePtr;
  uVar11 = (ulong)uVar8;
  iVar6 = 0;
  if (uVar11 < 0x7e000001) {
    iVar6 = uVar8 / 0xff + uVar8 + 0x10;
  }
  if (iVar6 <= targetDstSize) {
    iVar6 = LZ4_compress_fast_extState(__s,src,dst,uVar8,targetDstSize,1);
    goto LAB_002d446b;
  }
  iVar16 = (int)src;
  local_60 = (short *)dst;
  plVar13 = (long *)src;
  if ((int)uVar8 < 0x1000b) {
    iVar6 = 0;
    if (0x7e000000 < uVar8) goto LAB_002d446b;
    if (uVar8 == 0) {
      iVar6 = 0;
      if (0 < targetDstSize) {
        *dst = '\0';
        *srcSizePtr = 0;
        iVar6 = 1;
      }
      goto LAB_002d446b;
    }
    if (targetDstSize < 1) goto LAB_002d446b;
    pcVar24 = dst + targetDstSize;
    *(uint *)((long)__s + 0x4018) = uVar8;
    *(uint *)((long)__s + 0x4010) = uVar8;
    *(undefined4 *)((long)__s + 0x4014) = 3;
    if (0xc < uVar8) {
      *(undefined2 *)((long)__s + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) = 0;
LAB_002d3b24:
      uVar10 = 1;
      uVar28 = 0x40;
      iVar6 = *(int *)((long)plVar13 + 1);
      plVar12 = (long *)((long)plVar13 + 1);
      do {
        plVar21 = plVar12;
        plVar12 = (long *)(uVar10 + (long)plVar21);
        if (src + (uVar11 - 0xb) < plVar12) goto LAB_002d43d4;
        uVar10 = uVar28 >> 6;
        uVar28 = (ulong)((int)uVar28 + 1);
        uVar18 = (ulong)((uint)(iVar6 * -0x61c8864f) >> 0x13);
        uVar20 = (ulong)*(ushort *)((long)__s + uVar18 * 2);
        sVar4 = (short)src;
        iVar6 = (int)*plVar12;
        *(short *)((long)__s + uVar18 * 2) = (short)plVar21 - sVar4;
      } while (*(int *)(src + uVar20) != (int)*plVar21);
      lVar15 = 0;
      cVar5 = (char)plVar21 * '\x10' + (char)plVar13 * -0x10;
      do {
        cVar14 = cVar5;
        lVar19 = lVar15;
        pcVar22 = src + lVar19 + uVar20;
        plVar12 = (long *)((long)plVar21 + lVar19);
        if ((pcVar22 <= src) || (plVar12 <= plVar13)) break;
        lVar15 = lVar19 + -1;
        cVar5 = cVar14 + -0x10;
      } while (*(char *)((long)plVar21 + lVar19 + -1) == src[lVar19 + (uVar20 - 1)]);
      iVar26 = (int)plVar21 - (int)plVar13;
      iVar6 = (int)lVar19;
      uVar10 = (ulong)(uint)(iVar6 + iVar26);
      uVar8 = iVar26 + iVar6;
      if ((char *)((long)local_60 + uVar10 + (ulong)(uVar8 + 0xf0) / 0xff + 0xc) <= pcVar24) {
        if (uVar8 < 0xf) {
          psVar9 = (short *)((long)local_60 + 1);
          *(char *)local_60 = cVar14;
        }
        else {
          *(char *)local_60 = -0x10;
          psVar9 = local_60 + 1;
          for (iVar6 = ((int)plVar21 - (int)plVar13) + iVar6 + -0xf; 0xfe < iVar6;
              iVar6 = iVar6 + -0xff) {
            *(char *)((long)psVar9 + -1) = -1;
            psVar9 = (short *)((long)psVar9 + 1);
          }
          *(char *)((long)psVar9 + -1) = (char)iVar6;
        }
        psVar23 = (short *)(uVar10 + (long)psVar9);
        lVar15 = 0;
        do {
          pcVar2 = (char *)((long)psVar9 + lVar15);
          *(undefined8 *)pcVar2 = *(undefined8 *)((long)plVar13 + lVar15);
          lVar15 = lVar15 + 8;
        } while (pcVar2 + 8 < psVar23);
        do {
          if (pcVar24 < (char *)((long)psVar23 + 0xb)) break;
          *psVar23 = (short)plVar12 - (short)pcVar22;
          puVar1 = (ulong *)((long)plVar12 + 4);
          puVar27 = (ulong *)(pcVar22 + 4);
          puVar25 = puVar1;
          if (src + (uVar11 - 0xc) <= puVar1) {
LAB_002d3c95:
            iVar6 = ((int)puVar25 - (int)plVar12) + -4;
LAB_002d3c9f:
            if (puVar25 < src + (uVar11 - 0xc)) {
              if (*puVar27 == *puVar25) goto code_r0x002d3cb3;
              uVar28 = *puVar25 ^ *puVar27;
              uVar10 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                }
              }
              uVar10 = (ulong)(((uint)(uVar10 >> 3) & 0x1fffffff) + iVar6);
            }
            else {
              if ((puVar25 < src + (uVar11 - 8)) && ((int)*puVar27 == (int)*puVar25)) {
                puVar25 = (ulong *)((long)puVar25 + 4);
                puVar27 = (ulong *)((long)puVar27 + 4);
              }
              if ((puVar25 < src + (uVar11 - 6)) && ((short)*puVar27 == (short)*puVar25)) {
                puVar25 = (ulong *)((long)puVar25 + 2);
                puVar27 = (ulong *)((long)puVar27 + 2);
              }
              if (puVar25 < src + (uVar11 - 5)) {
                puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar27 == (char)*puVar25));
              }
              uVar10 = (ulong)(uint)((int)puVar25 - (int)puVar1);
            }
            goto LAB_002d3cdc;
          }
          if (*puVar27 == *puVar1) {
            puVar27 = (ulong *)(pcVar22 + 0xc);
            puVar25 = (ulong *)((long)plVar12 + 0xc);
            goto LAB_002d3c95;
          }
          uVar28 = *puVar1 ^ *puVar27;
          uVar10 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
            }
          }
          uVar10 = uVar10 >> 3 & 0x1fffffff;
LAB_002d3cdc:
          psVar9 = psVar23 + 1;
          uVar7 = (uint)uVar10;
          plVar12 = (long *)((long)plVar12 + uVar10 + 4);
          uVar8 = uVar7;
          if (pcVar24 < (char *)((long)psVar23 + (ulong)(uVar7 + 0xf0) / 0xff + 8)) {
            uVar8 = ((int)pcVar24 - (int)psVar9) * 0xff - 0x5ec;
            plVar12 = (long *)((long)plVar12 - (ulong)(uVar7 - uVar8));
            plVar13 = plVar12;
            if (plVar12 <= plVar21) {
              for (; plVar13 <= plVar21; plVar13 = (long *)((long)plVar13 + 1)) {
                *(undefined2 *)
                 ((long)__s + (ulong)((uint)((int)*plVar13 * -0x61c8864f) >> 0x13) * 2) = 0;
              }
            }
          }
          if (uVar8 < 0xf) {
            *(char *)local_60 = (char)*local_60 + (char)uVar8;
            local_60 = psVar9;
          }
          else {
            *(char *)local_60 = (char)*local_60 + '\x0f';
            psVar9[0] = -1;
            psVar9[1] = -1;
            lVar15 = 0;
            for (uVar7 = uVar8 - 0xf; 0x3fb < uVar7; uVar7 = uVar7 - 0x3fc) {
              pcVar22 = (char *)((long)psVar23 + lVar15 + 6);
              pcVar22[0] = -1;
              pcVar22[1] = -1;
              pcVar22[2] = -1;
              pcVar22[3] = -1;
              lVar15 = lVar15 + 4;
            }
            lVar19 = lVar15 + (ulong)(uVar7 & 0xffff) / 0xff;
            *(char *)((long)psVar23 + lVar19 + 2) =
                 (char)((ushort)uVar7 / 0xff) + (char)uVar8 + -0xf + (char)lVar15;
            local_60 = (short *)((long)psVar23 + lVar19 + 3);
          }
          plVar13 = plVar12;
          if (src + (uVar11 - 0xb) <= plVar12) break;
          *(short *)((long)__s +
                    (ulong)((uint)(*(int *)((long)plVar12 + -2) * -0x61c8864f) >> 0x13) * 2) =
               ((short)plVar12 + -2) - sVar4;
          uVar10 = (ulong)((uint)((int)*plVar12 * -0x61c8864f) >> 0x13);
          uVar3 = *(ushort *)((long)__s + uVar10 * 2);
          pcVar22 = src + uVar3;
          *(short *)((long)__s + uVar10 * 2) = (short)plVar12 - sVar4;
          if (*(int *)(src + uVar3) != (int)*plVar12) goto LAB_002d3b24;
          psVar23 = (short *)((long)local_60 + 1);
          *(char *)local_60 = '\0';
        } while( true );
      }
    }
LAB_002d43d4:
    pcVar22 = src + (uVar11 - (long)plVar13);
    if (pcVar24 < (char *)((long)local_60 + (long)(pcVar22 + (ulong)(pcVar22 + 0xf0) / 0xff + 1))) {
      pcVar22 = pcVar24 + (~(ulong)local_60 - ((ulong)(pcVar24 + ~(ulong)local_60 + 0xf1) >> 8));
    }
    if (pcVar22 < (char *)0xf) {
      *(char *)local_60 = (char)pcVar22 << 4;
    }
    else {
      *(char *)local_60 = -0x10;
      for (pcVar24 = pcVar22 + -0xf; local_60 = (short *)((long)local_60 + 1),
          (char *)0xfe < pcVar24; pcVar24 = pcVar24 + -0xff) {
        *(char *)local_60 = -1;
      }
      *(char *)local_60 = (char)pcVar24;
    }
  }
  else {
    iVar6 = 0;
    if ((0x7e000000 < uVar8) || (targetDstSize < 1)) goto LAB_002d446b;
    pcVar24 = dst + targetDstSize;
    *(uint *)((long)__s + 0x4018) = uVar8;
    *(uint *)((long)__s + 0x4010) = uVar8;
    *(undefined4 *)((long)__s + 0x4014) = 2;
    *(undefined4 *)((long)__s + ((ulong)(*(long *)src * -0x30e4432345000000) >> 0x34) * 4) = 0;
LAB_002d3f49:
    uVar28 = 0x40;
    uVar10 = 1;
    lVar15 = *(long *)((long)plVar13 + 1);
    plVar12 = (long *)((long)plVar13 + 1);
    while( true ) {
      plVar21 = (long *)(uVar10 + (long)plVar12);
      if (src + (uVar11 - 0xb) < plVar21) goto LAB_002d4341;
      uVar20 = (ulong)(lVar15 * -0x30e4432345000000) >> 0x34;
      uVar8 = *(uint *)((long)__s + uVar20 * 4);
      uVar10 = (ulong)uVar8;
      iVar6 = (int)plVar12;
      lVar15 = *plVar21;
      *(int *)((long)__s + uVar20 * 4) = iVar6 - iVar16;
      if (((uint)(iVar6 - iVar16) <= uVar8 + 0xffff) && (*(int *)(src + uVar10) == (int)*plVar12))
      break;
      uVar10 = uVar28 >> 6;
      uVar28 = (ulong)((int)uVar28 + 1);
      plVar12 = plVar21;
    }
    lVar15 = 0;
    cVar5 = (char)plVar12 * '\x10' + (char)plVar13 * -0x10;
    do {
      cVar14 = cVar5;
      lVar19 = lVar15;
      piVar29 = (int *)(src + lVar19 + uVar10);
      plVar21 = (long *)((long)plVar12 + lVar19);
      if ((piVar29 <= src) || (plVar21 <= plVar13)) break;
      lVar15 = lVar19 + -1;
      cVar5 = cVar14 + -0x10;
    } while (*(char *)((long)plVar12 + lVar19 + -1) == src[lVar19 + (uVar10 - 1)]);
    iVar17 = iVar6 - (int)plVar13;
    iVar26 = (int)lVar19;
    uVar10 = (ulong)(uint)(iVar17 + iVar26);
    uVar8 = iVar17 + iVar26;
    if ((char *)((long)local_60 + uVar10 + (ulong)(uVar8 + 0xf0) / 0xff + 0xc) <= pcVar24) {
      if (uVar8 < 0xf) {
        psVar9 = (short *)((long)local_60 + 1);
        *(char *)local_60 = cVar14;
      }
      else {
        *(char *)local_60 = -0x10;
        psVar9 = local_60 + 1;
        for (iVar6 = (iVar6 - (int)plVar13) + iVar26 + -0xf; 0xfe < iVar6; iVar6 = iVar6 + -0xff) {
          *(char *)((long)psVar9 + -1) = -1;
          psVar9 = (short *)((long)psVar9 + 1);
        }
        *(char *)((long)psVar9 + -1) = (char)iVar6;
      }
      psVar23 = (short *)(uVar10 + (long)psVar9);
      lVar15 = 0;
      do {
        pcVar22 = (char *)((long)psVar9 + lVar15);
        *(undefined8 *)pcVar22 = *(undefined8 *)((long)plVar13 + lVar15);
        lVar15 = lVar15 + 8;
      } while (pcVar22 + 8 < psVar23);
      do {
        if (pcVar24 < (char *)((long)psVar23 + 0xb)) break;
        *psVar23 = (short)plVar21 - (short)piVar29;
        puVar1 = (ulong *)((long)plVar21 + 4);
        puVar27 = (ulong *)(piVar29 + 1);
        puVar25 = puVar1;
        if (src + (uVar11 - 0xc) <= puVar1) {
LAB_002d40c3:
          iVar6 = ((int)puVar25 - (int)plVar21) + -4;
LAB_002d40cd:
          if (puVar25 < src + (uVar11 - 0xc)) {
            if (*puVar27 == *puVar25) goto code_r0x002d40e1;
            uVar28 = *puVar25 ^ *puVar27;
            uVar10 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
              }
            }
            uVar10 = (ulong)(((uint)(uVar10 >> 3) & 0x1fffffff) + iVar6);
          }
          else {
            if ((puVar25 < src + (uVar11 - 8)) && ((int)*puVar27 == (int)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 4);
              puVar27 = (ulong *)((long)puVar27 + 4);
            }
            if ((puVar25 < src + (uVar11 - 6)) && ((short)*puVar27 == (short)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 2);
              puVar27 = (ulong *)((long)puVar27 + 2);
            }
            if (puVar25 < src + (uVar11 - 5)) {
              puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar27 == (char)*puVar25));
            }
            uVar10 = (ulong)(uint)((int)puVar25 - (int)puVar1);
          }
          goto LAB_002d4114;
        }
        if (*puVar27 == *puVar1) {
          puVar27 = (ulong *)(piVar29 + 3);
          puVar25 = (ulong *)((long)plVar21 + 0xc);
          goto LAB_002d40c3;
        }
        uVar28 = *puVar1 ^ *puVar27;
        uVar10 = 0;
        if (uVar28 != 0) {
          for (; (uVar28 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
        uVar10 = uVar10 >> 3 & 0x1fffffff;
LAB_002d4114:
        psVar9 = psVar23 + 1;
        uVar8 = (uint)uVar10;
        plVar21 = (long *)((long)plVar21 + uVar10 + 4);
        if (pcVar24 < (char *)((long)psVar23 + (ulong)(uVar8 + 0xf0) / 0xff + 8)) {
          uVar7 = ((int)pcVar24 - (int)psVar9) * 0xff - 0x5ec;
          plVar21 = (long *)((long)plVar21 - (ulong)(uVar8 - uVar7));
          plVar13 = plVar21;
          uVar8 = uVar7;
          if (plVar21 <= plVar12) {
            for (; plVar13 <= plVar12; plVar13 = (long *)((long)plVar13 + 1)) {
              *(undefined4 *)((long)__s + ((ulong)(*plVar13 * -0x30e4432345000000) >> 0x34) * 4) = 0
              ;
            }
          }
        }
        if (uVar8 < 0xf) {
          *(char *)local_60 = (char)*local_60 + (char)uVar8;
          local_60 = psVar9;
        }
        else {
          *(char *)local_60 = (char)*local_60 + '\x0f';
          psVar9[0] = -1;
          psVar9[1] = -1;
          lVar15 = 0;
          for (uVar7 = uVar8 - 0xf; 0x3fb < uVar7; uVar7 = uVar7 - 0x3fc) {
            pcVar22 = (char *)((long)psVar23 + lVar15 + 6);
            pcVar22[0] = -1;
            pcVar22[1] = -1;
            pcVar22[2] = -1;
            pcVar22[3] = -1;
            lVar15 = lVar15 + 4;
          }
          lVar19 = lVar15 + (ulong)(uVar7 & 0xffff) / 0xff;
          *(char *)((long)psVar23 + lVar19 + 2) =
               (char)((uVar7 & 0xffff) / 0xff) + (char)uVar8 + -0xf + (char)lVar15;
          local_60 = (short *)((long)psVar23 + lVar19 + 3);
        }
        plVar13 = plVar21;
        if (src + (uVar11 - 0xb) <= plVar21) break;
        *(int *)((long)__s +
                ((ulong)(*(long *)((long)plVar21 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
             ((int)plVar21 + -2) - iVar16;
        uVar10 = (ulong)(*plVar21 * -0x30e4432345000000) >> 0x34;
        uVar7 = (int)plVar21 - iVar16;
        uVar8 = *(uint *)((long)__s + uVar10 * 4);
        piVar29 = (int *)(src + uVar8);
        *(uint *)((long)__s + uVar10 * 4) = uVar7;
        if ((uVar8 + 0xffff < uVar7) || (*piVar29 != (int)*plVar21)) goto LAB_002d3f49;
        psVar23 = (short *)((long)local_60 + 1);
        *(char *)local_60 = '\0';
      } while( true );
    }
LAB_002d4341:
    pcVar22 = src + (uVar11 - (long)plVar13);
    if (pcVar24 < (char *)((long)local_60 + (long)(pcVar22 + (ulong)(pcVar22 + 0xf0) / 0xff + 1))) {
      pcVar22 = pcVar24 + (~(ulong)local_60 - ((ulong)(pcVar24 + ~(ulong)local_60 + 0xf1) >> 8));
    }
    if (pcVar22 < (char *)0xf) {
      *(char *)local_60 = (char)pcVar22 << 4;
    }
    else {
      *(char *)local_60 = -0x10;
      for (pcVar24 = pcVar22 + -0xf; local_60 = (short *)((long)local_60 + 1),
          (char *)0xfe < pcVar24; pcVar24 = pcVar24 + -0xff) {
        *(char *)local_60 = -1;
      }
      *(char *)local_60 = (char)pcVar24;
    }
  }
  memcpy((char *)((long)local_60 + 1),plVar13,(size_t)pcVar22);
  *srcSizePtr = ((int)plVar13 + (int)pcVar22) - iVar16;
  local_58 = (int)dst;
  iVar6 = ((int)(char *)((long)local_60 + 1) + (int)pcVar22) - local_58;
LAB_002d446b:
  free(__s);
  return iVar6;
code_r0x002d40e1:
  puVar25 = puVar25 + 1;
  puVar27 = puVar27 + 1;
  iVar6 = iVar6 + 8;
  goto LAB_002d40cd;
code_r0x002d3cb3:
  puVar25 = puVar25 + 1;
  puVar27 = puVar27 + 1;
  iVar6 = iVar6 + 8;
  goto LAB_002d3c9f;
}

Assistant:

int LZ4_compress_destSize(const char* src, char* dst, int* srcSizePtr, int targetDstSize)
{
#if (LZ4_HEAPMODE)
    LZ4_stream_t* ctx = (LZ4_stream_t*)ALLOC(sizeof(LZ4_stream_t));   /* malloc-calloc always properly aligned */
    if (ctx == NULL) return 0;
#else
    LZ4_stream_t ctxBody;
    LZ4_stream_t* ctx = &ctxBody;
#endif

    int result = LZ4_compress_destSize_extState(ctx, src, dst, srcSizePtr, targetDstSize);

#if (LZ4_HEAPMODE)
    FREEMEM(ctx);
#endif
    return result;
}